

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall
FfsParser::parseVendorHashFile(FfsParser *this,UByteArray *fileGuid,UModelIndex *index)

{
  CBString *pCVar1;
  TreeModel *pTVar2;
  FfsParser *pFVar3;
  bool bVar4;
  __type _Var5;
  UINT32 UVar6;
  ulong uVar7;
  vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_> *pvVar8;
  UINT8 i;
  uint uVar9;
  ulong uVar10;
  pointer pcVar11;
  long *plVar12;
  UINT8 j;
  long lVar13;
  undefined1 local_d8 [16];
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  UByteArray local_a8;
  vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_> *local_88;
  FfsParser *local_80;
  UModelIndex *local_78;
  pointer local_70;
  UModelIndex fileIndex;
  UByteArray local_50;
  
  bVar4 = UModelIndex::isValid(index);
  if (!bVar4) {
    return 1;
  }
  TreeModel::body(&local_50,this->model,index);
  _Var5 = std::operator==(&fileGuid->d,&PROTECTED_RANGE_VENDOR_HASH_FILE_GUID_PHOENIX.d);
  uVar9 = (uint)local_50.d._M_string_length;
  if (_Var5) {
    local_80 = this;
    local_78 = index;
    if (uVar9 < 0xc) {
      usprintf((CBString *)local_d8,"%s: unknown or corrupted Phoenix protected ranges hash file",
               "parseVendorHashFile");
      msg(this,(CBString *)local_d8,index);
LAB_0012a6c0:
      Bstrlib::CBString::~CBString((CBString *)local_d8);
    }
    else if (*(long *)local_50.d._M_dataplus._M_p == 0x4c42544853414824) {
      uVar7 = (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 8);
      if ((local_50.d._M_string_length & 0xffffffff) < uVar7 * 0x28 + 0xc) {
        usprintf((CBString *)local_d8,"%s: unknown or corrupted Phoenix protected ranges hash file",
                 "parseVendorHashFile");
        msg(local_80,(CBString *)local_d8,local_78);
        goto LAB_0012a6c0;
      }
      if (*(uint *)(local_50.d._M_dataplus._M_p + 8) != 0) {
        local_70 = local_50.d._M_dataplus._M_p + 0xc;
        local_88 = &this->protectedRanges;
        plVar12 = (long *)(local_50.d._M_dataplus._M_p + 0x2c);
        bVar4 = false;
        for (uVar10 = 0; pFVar3 = local_80, uVar10 < uVar7; uVar10 = uVar10 + 1) {
          if (((int)*plVar12 != -1) && (1 < *(int *)((long)plVar12 + 4) + 1U)) {
            local_d8[10] = '\0';
            local_c0 = 0;
            local_b8._M_local_buf[0] = '\0';
            local_d8._0_8_ = *plVar12;
            local_d8._8_2_ = 0xb;
            local_c8._M_p = (pointer)&local_b8;
            UByteArray::UByteArray(&local_a8,(char *)(plVar12 + -4),0x20);
            std::__cxx11::string::_M_assign((string *)&local_c8);
            std::__cxx11::string::~string((string *)&local_a8);
            local_d8[10] = '\x04';
            std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                      (local_88,(value_type *)local_d8);
            std::__cxx11::string::~string((string *)&local_c8);
            uVar7 = (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 8);
            bVar4 = true;
          }
          plVar12 = plVar12 + 5;
        }
        if (bVar4) {
          UVar6 = TreeModel::base(local_80->model,local_78);
          usprintf((CBString *)local_d8,"Phoenix hash file found at base %08Xh\nProtected ranges:\n"
                   ,(ulong)UVar6);
          pCVar1 = &pFVar3->securityInfo;
          Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
          Bstrlib::CBString::~CBString((CBString *)local_d8);
          pvVar8 = (vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_> *)0x0;
          pcVar11 = local_70;
          while (pvVar8 < (long *)(ulong)*(uint *)(local_50.d._M_dataplus._M_p + 8)) {
            local_88 = pvVar8;
            usprintf((CBString *)local_d8,"RelativeOffset: %08Xh Size: %Xh\nHash: ",
                     (ulong)*(uint *)(local_70 + (long)pvVar8 * 0x28 + 0x20),
                     (ulong)*(uint *)(local_70 + (long)pvVar8 * 0x28 + 0x24));
            Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
            Bstrlib::CBString::~CBString((CBString *)local_d8);
            for (lVar13 = 0; lVar13 != 0x20; lVar13 = lVar13 + 1) {
              usprintf((CBString *)local_d8,"%02X",(ulong)(byte)pcVar11[lVar13]);
              Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
              Bstrlib::CBString::~CBString((CBString *)local_d8);
            }
            Bstrlib::CBString::operator+=(pCVar1,"\n");
            pcVar11 = pcVar11 + 0x28;
            pvVar8 = (vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_> *)
                     ((long)&(local_88->
                             super__Vector_base<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1);
          }
        }
      }
    }
    pTVar2 = local_80->model;
    Bstrlib::CBString::CBString((CBString *)local_d8,"Phoenix protected ranges hash file");
    TreeModel::setText(pTVar2,local_78,(CBString *)local_d8);
  }
  else {
    _Var5 = std::operator==(&fileGuid->d,&PROTECTED_RANGE_VENDOR_HASH_FILE_GUID_AMI.d);
    if (!_Var5) goto LAB_0012b0e1;
    TreeModel::parent(&fileIndex,this->model,index);
    if (uVar9 == 0x70) {
      UVar6 = TreeModel::base(this->model,&fileIndex);
      usprintf((CBString *)local_d8,
               "AMI v3 protected ranges hash file found at base %08Xh\nProtected ranges:",
               (ulong)UVar6);
      pCVar1 = &this->securityInfo;
      Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
      Bstrlib::CBString::~CBString((CBString *)local_d8);
      usprintf((CBString *)local_d8,"\nFvBaseSegment 0 Address: %08Xh, Size: %Xh",
               (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 0x20),
               (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 0x2c));
      Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
      Bstrlib::CBString::~CBString((CBString *)local_d8);
      usprintf((CBString *)local_d8,"\nFvBaseSegment 1 Address: %08Xh, Size: %Xh",
               (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 0x24),
               (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 0x30));
      Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
      Bstrlib::CBString::~CBString((CBString *)local_d8);
      usprintf((CBString *)local_d8,"\nFvBaseSegment 2 Address: %08Xh, Size: %Xh",
               (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 0x28),
               (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 0x34));
      Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
      Bstrlib::CBString::~CBString((CBString *)local_d8);
      usprintf((CBString *)local_d8,"\nNestedFvBase Address: %08Xh, Size: %Xh",
               (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 0x38),
               (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 0x3c));
      Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
      Bstrlib::CBString::~CBString((CBString *)local_d8);
      usprintf((CBString *)local_d8,"\nHash (SHA256): ");
      Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
      Bstrlib::CBString::~CBString((CBString *)local_d8);
      for (lVar13 = 0; lVar13 != 0x20; lVar13 = lVar13 + 1) {
        usprintf((CBString *)local_d8,"%02X",(ulong)(byte)local_50.d._M_dataplus._M_p[lVar13]);
        Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
        Bstrlib::CBString::~CBString((CBString *)local_d8);
      }
      Bstrlib::CBString::operator+=(pCVar1,"\n");
      if (((int)*(long *)(local_50.d._M_dataplus._M_p + 0x20) != -1) &&
         (1 < *(int *)(local_50.d._M_dataplus._M_p + 0x2c) + 1U)) {
        local_c8._M_p = (pointer)&local_b8;
        local_d8[10] = '\0';
        local_c0 = 0;
        local_b8._M_local_buf[0] = '\0';
        local_d8._4_4_ = *(int *)(local_50.d._M_dataplus._M_p + 0x2c);
        local_d8._0_4_ = (int)*(long *)(local_50.d._M_dataplus._M_p + 0x20);
        local_d8._8_2_ = 0xb;
        UByteArray::UByteArray(&local_a8,local_50.d._M_dataplus._M_p,0x20);
        std::__cxx11::string::_M_assign((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_a8);
        local_d8[10] = '\a';
        std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                  (&this->protectedRanges,(value_type *)local_d8);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      if ((*(int *)(local_50.d._M_dataplus._M_p + 0x24) != -1) &&
         (1 < (int)*(long *)(local_50.d._M_dataplus._M_p + 0x30) + 1U)) {
        local_c8._M_p = (pointer)&local_b8;
        local_d8[10] = '\0';
        local_c0 = 0;
        local_b8._M_local_buf[0] = '\0';
        local_d8._4_4_ = (int)*(long *)(local_50.d._M_dataplus._M_p + 0x30);
        local_d8._0_4_ = *(int *)(local_50.d._M_dataplus._M_p + 0x24);
        local_d8._8_2_ = 0xb;
        UByteArray::UByteArray(&local_a8,local_50.d._M_dataplus._M_p,0x20);
        std::__cxx11::string::_M_assign((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_a8);
        local_d8[10] = '\a';
        std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                  (&this->protectedRanges,(value_type *)local_d8);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      if (((int)*(long *)(local_50.d._M_dataplus._M_p + 0x28) != -1) &&
         (1 < *(int *)(local_50.d._M_dataplus._M_p + 0x34) + 1U)) {
        local_c8._M_p = (pointer)&local_b8;
        local_d8[10] = '\0';
        local_c0 = 0;
        local_b8._M_local_buf[0] = '\0';
        local_d8._4_4_ = *(int *)(local_50.d._M_dataplus._M_p + 0x34);
        local_d8._0_4_ = (int)*(long *)(local_50.d._M_dataplus._M_p + 0x28);
        local_d8._8_2_ = 0xb;
        UByteArray::UByteArray(&local_a8,local_50.d._M_dataplus._M_p,0x20);
        std::__cxx11::string::_M_assign((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_a8);
        local_d8[10] = '\a';
        std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                  (&this->protectedRanges,(value_type *)local_d8);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      if (((int)*(long *)(local_50.d._M_dataplus._M_p + 0x38) != -1) &&
         (1 < *(int *)(local_50.d._M_dataplus._M_p + 0x3c) + 1U)) {
        local_c8._M_p = (pointer)&local_b8;
        local_d8[10] = '\0';
        local_c0 = 0;
        local_b8._M_local_buf[0] = '\0';
        local_d8._4_4_ = *(int *)(local_50.d._M_dataplus._M_p + 0x3c);
        local_d8._0_4_ = (int)*(long *)(local_50.d._M_dataplus._M_p + 0x38);
        local_d8._8_2_ = 0xb;
        UByteArray::UByteArray(&local_a8,local_50.d._M_dataplus._M_p,0x20);
        std::__cxx11::string::_M_assign((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_a8);
        local_d8[10] = '\a';
        std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                  (&this->protectedRanges,(value_type *)local_d8);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      pTVar2 = this->model;
      Bstrlib::CBString::CBString((CBString *)local_d8,"AMI v3 protected ranges hash file");
      TreeModel::setText(pTVar2,&fileIndex,(CBString *)local_d8);
    }
    else if (uVar9 == 0x50) {
      UVar6 = TreeModel::base(this->model,&fileIndex);
      usprintf((CBString *)local_d8,
               "AMI v2 protected ranges hash file found at base %08Xh\nProtected ranges:",
               (ulong)UVar6);
      pCVar1 = &this->securityInfo;
      Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
      Bstrlib::CBString::~CBString((CBString *)local_d8);
      usprintf((CBString *)local_d8,"\nAddress: %08Xh, Size: %Xh\nHash (SHA256): ",
               (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 0x20),
               (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 0x24));
      Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
      Bstrlib::CBString::~CBString((CBString *)local_d8);
      for (lVar13 = 0; lVar13 != 0x20; lVar13 = lVar13 + 1) {
        usprintf((CBString *)local_d8,"%02X",(ulong)(byte)local_50.d._M_dataplus._M_p[lVar13]);
        Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
        Bstrlib::CBString::~CBString((CBString *)local_d8);
      }
      usprintf((CBString *)local_d8,"\nAddress: %08Xh, Size: %Xh\nHash (SHA256): ",
               (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 0x48),
               (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 0x4c));
      Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
      local_88 = (vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_> *)
                 (local_50.d._M_dataplus._M_p + 0x28);
      Bstrlib::CBString::~CBString((CBString *)local_d8);
      for (lVar13 = 0x28; lVar13 != 0x48; lVar13 = lVar13 + 1) {
        usprintf((CBString *)local_d8,"%02X",(ulong)(byte)local_50.d._M_dataplus._M_p[lVar13]);
        Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
        Bstrlib::CBString::~CBString((CBString *)local_d8);
      }
      Bstrlib::CBString::operator+=(pCVar1,"\n");
      if (((int)*(long *)(local_50.d._M_dataplus._M_p + 0x20) != -1) &&
         (1 < *(int *)(local_50.d._M_dataplus._M_p + 0x24) + 1U)) {
        local_c8._M_p = (pointer)&local_b8;
        local_d8[10] = '\0';
        local_c0 = 0;
        local_b8._M_local_buf[0] = '\0';
        local_d8._4_4_ = *(int *)(local_50.d._M_dataplus._M_p + 0x24);
        local_d8._0_4_ = (int)*(long *)(local_50.d._M_dataplus._M_p + 0x20);
        local_d8._8_2_ = 0xb;
        UByteArray::UByteArray(&local_a8,local_50.d._M_dataplus._M_p,0x20);
        std::__cxx11::string::_M_assign((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_a8);
        local_d8[10] = '\x06';
        std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                  (&this->protectedRanges,(value_type *)local_d8);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      if (((int)*(long *)(local_50.d._M_dataplus._M_p + 0x48) != -1) &&
         (1 < *(int *)(local_50.d._M_dataplus._M_p + 0x4c) + 1U)) {
        local_c8._M_p = (pointer)&local_b8;
        local_d8[10] = '\0';
        local_c0 = 0;
        local_b8._M_local_buf[0] = '\0';
        local_d8._4_4_ = *(int *)(local_50.d._M_dataplus._M_p + 0x4c);
        local_d8._0_4_ = (int)*(long *)(local_50.d._M_dataplus._M_p + 0x48);
        local_d8._8_2_ = 0xb;
        UByteArray::UByteArray(&local_a8,(char *)local_88,0x20);
        std::__cxx11::string::_M_assign((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_a8);
        local_d8[10] = '\x06';
        std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                  (&this->protectedRanges,(value_type *)local_d8);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      pTVar2 = this->model;
      Bstrlib::CBString::CBString((CBString *)local_d8,"AMI v2 protected ranges hash file");
      TreeModel::setText(pTVar2,&fileIndex,(CBString *)local_d8);
    }
    else if (uVar9 == 0x24) {
      UVar6 = TreeModel::base(this->model,&fileIndex);
      usprintf((CBString *)local_d8,
               "AMI protected ranges hash file v1 found at base %08Xh\nProtected range:\n",
               (ulong)UVar6);
      pCVar1 = &this->securityInfo;
      Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
      Bstrlib::CBString::~CBString((CBString *)local_d8);
      usprintf((CBString *)local_d8,"Size: %Xh\nHash (SHA256): ",
               (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 0x20));
      Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
      Bstrlib::CBString::~CBString((CBString *)local_d8);
      for (lVar13 = 0; lVar13 != 0x20; lVar13 = lVar13 + 1) {
        usprintf((CBString *)local_d8,"%02X",(ulong)(byte)local_50.d._M_dataplus._M_p[lVar13]);
        Bstrlib::CBString::operator+=(pCVar1,(CBString *)local_d8);
        Bstrlib::CBString::~CBString((CBString *)local_d8);
      }
      Bstrlib::CBString::operator+=(pCVar1,"\n");
      if (1 < *(uint *)(local_50.d._M_dataplus._M_p + 0x20) + 1) {
        local_c8._M_p = (pointer)&local_b8;
        local_d8[10] = '\0';
        local_c0 = 0;
        local_b8._M_local_buf[0] = '\0';
        local_d8._0_8_ = (ulong)*(uint *)(local_50.d._M_dataplus._M_p + 0x20) << 0x20;
        local_d8._8_2_ = 0xb;
        UByteArray::UByteArray(&local_a8,local_50.d._M_dataplus._M_p,0x20);
        std::__cxx11::string::_M_assign((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_a8);
        local_d8[10] = '\x05';
        std::vector<PROTECTED_RANGE_,_std::allocator<PROTECTED_RANGE_>_>::push_back
                  (&this->protectedRanges,(value_type *)local_d8);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      pTVar2 = this->model;
      Bstrlib::CBString::CBString((CBString *)local_d8,"AMI v1 protected ranges hash file");
      TreeModel::setText(pTVar2,&fileIndex,(CBString *)local_d8);
    }
    else {
      usprintf((CBString *)local_d8,"%s: unknown or corrupted AMI protected ranges hash file",
               "parseVendorHashFile");
      msg(this,(CBString *)local_d8,&fileIndex);
    }
  }
  Bstrlib::CBString::~CBString((CBString *)local_d8);
LAB_0012b0e1:
  std::__cxx11::string::~string((string *)&local_50);
  return 0;
}

Assistant:

USTATUS FfsParser::parseVendorHashFile(const UByteArray & fileGuid, const UModelIndex & index)
{
    // Check sanity
    if (!index.isValid()) {
        return U_INVALID_PARAMETER;
    }
    
    const UByteArray& body = model->body(index);
    UINT32 size = (UINT32)body.size();
    if (fileGuid == PROTECTED_RANGE_VENDOR_HASH_FILE_GUID_PHOENIX) {
        if (size < sizeof(PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_PHOENIX)) {
            msg(usprintf("%s: unknown or corrupted Phoenix protected ranges hash file", __FUNCTION__), index);
        }
        else {
            const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_PHOENIX* header = (const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_PHOENIX*)body.constData();
            if (header->Signature == BG_VENDOR_HASH_FILE_SIGNATURE_PHOENIX) {
                if (size < sizeof(PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_PHOENIX) + header->NumEntries * sizeof(PROTECTED_RANGE_VENDOR_HASH_FILE_ENTRY)) {
                    msg(usprintf("%s: unknown or corrupted Phoenix protected ranges hash file", __FUNCTION__), index);
                }
                else {
                    if (header->NumEntries > 0) {
                        bool protectedRangesFound = false;
                        for (UINT32 i = 0; i < header->NumEntries; i++) {
                            const PROTECTED_RANGE_VENDOR_HASH_FILE_ENTRY* entry = (const PROTECTED_RANGE_VENDOR_HASH_FILE_ENTRY*)(header + 1) + i;
                            if (entry->Base != 0xFFFFFFFF && entry->Size != 0 && entry->Size != 0xFFFFFFFF) {
                                protectedRangesFound = true;
                                PROTECTED_RANGE range = {};
                                range.Offset = entry->Base;
                                range.Size = entry->Size;
                                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                                range.Hash = UByteArray((const char*)entry->Hash, sizeof(entry->Hash));
                                range.Type = PROTECTED_RANGE_VENDOR_HASH_PHOENIX;
                                protectedRanges.push_back(range);
                            }
                        }

                        if (protectedRangesFound) {
                            securityInfo += usprintf("Phoenix hash file found at base %08Xh\nProtected ranges:\n", model->base(index));
                            for (UINT32 i = 0; i < header->NumEntries; i++) {
                                const PROTECTED_RANGE_VENDOR_HASH_FILE_ENTRY* entry = (const PROTECTED_RANGE_VENDOR_HASH_FILE_ENTRY*)(header + 1) + i;
                                securityInfo += usprintf("RelativeOffset: %08Xh Size: %Xh\nHash: ", entry->Base, entry->Size);
                                for (UINT8 j = 0; j < sizeof(entry->Hash); j++) {
                                    securityInfo += usprintf("%02X", entry->Hash[j]);
                                }
                                securityInfo += "\n";
                            }
                        }
                    }
                }
            }
        }

        model->setText(index, UString("Phoenix protected ranges hash file"));
    }
    else if (fileGuid == PROTECTED_RANGE_VENDOR_HASH_FILE_GUID_AMI) {
        UModelIndex fileIndex = model->parent(index);
        if (size == sizeof(PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V1)) {
            securityInfo += usprintf("AMI protected ranges hash file v1 found at base %08Xh\nProtected range:\n", model->base(fileIndex));
            const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V1* entry = (const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V1*)(body.constData());
            securityInfo += usprintf("Size: %Xh\nHash (SHA256): ", entry->Size);
            for (UINT8 i = 0; i < sizeof(entry->Hash); i++) {
                securityInfo += usprintf("%02X", entry->Hash[i]);
            }
            securityInfo += "\n";

            if (entry->Size != 0 && entry->Size != 0xFFFFFFFF) {
                PROTECTED_RANGE range = {};
                range.Offset = 0;
                range.Size = entry->Size;
                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                range.Hash = UByteArray((const char*)entry->Hash, sizeof(entry->Hash));
                range.Type = PROTECTED_RANGE_VENDOR_HASH_AMI_V1;
                protectedRanges.push_back(range);
            }

            model->setText(fileIndex, UString("AMI v1 protected ranges hash file"));
        }
        else if (size == sizeof(PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V2)) {
            const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V2* entry = (const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V2*)(body.constData());

            securityInfo += usprintf("AMI v2 protected ranges hash file found at base %08Xh\nProtected ranges:", model->base(fileIndex));
            securityInfo += usprintf("\nAddress: %08Xh, Size: %Xh\nHash (SHA256): ", entry->Hash0.Base, entry->Hash0.Size);
            for (UINT8 j = 0; j < sizeof(entry->Hash0.Hash); j++) {
                securityInfo += usprintf("%02X", entry->Hash0.Hash[j]);
            }
            securityInfo += usprintf("\nAddress: %08Xh, Size: %Xh\nHash (SHA256): ", entry->Hash1.Base, entry->Hash1.Size);
            for (UINT8 j = 0; j < sizeof(entry->Hash1.Hash); j++) {
                securityInfo += usprintf("%02X", entry->Hash1.Hash[j]);
            }
            securityInfo += "\n";

            if (entry->Hash0.Base != 0xFFFFFFFF && entry->Hash0.Size != 0 && entry->Hash0.Size != 0xFFFFFFFF) {
                PROTECTED_RANGE range = {};
                range.Offset = entry->Hash0.Base;
                range.Size = entry->Hash0.Size;
                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                range.Hash = UByteArray((const char*)entry->Hash0.Hash, sizeof(entry->Hash0.Hash));
                range.Type = PROTECTED_RANGE_VENDOR_HASH_AMI_V2;
                protectedRanges.push_back(range);
            }

            if (entry->Hash1.Base != 0xFFFFFFFF && entry->Hash1.Size != 0 && entry->Hash1.Size != 0xFFFFFFFF) {
                PROTECTED_RANGE range = {};
                range.Offset = entry->Hash1.Base;
                range.Size = entry->Hash1.Size;
                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                range.Hash = UByteArray((const char*)entry->Hash1.Hash, sizeof(entry->Hash1.Hash));
                range.Type = PROTECTED_RANGE_VENDOR_HASH_AMI_V2;
                protectedRanges.push_back(range);
            }

            model->setText(fileIndex, UString("AMI v2 protected ranges hash file"));
        }
        else if (size == sizeof(PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V3)) {
            const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V3* entry = (const PROTECTED_RANGE_VENDOR_HASH_FILE_HEADER_AMI_V3*)(body.constData());
            securityInfo += usprintf("AMI v3 protected ranges hash file found at base %08Xh\nProtected ranges:", model->base(fileIndex));
            securityInfo += usprintf("\nFvBaseSegment 0 Address: %08Xh, Size: %Xh", entry->FvMainSegmentBase[0], entry->FvMainSegmentSize[0]);
            securityInfo += usprintf("\nFvBaseSegment 1 Address: %08Xh, Size: %Xh", entry->FvMainSegmentBase[1], entry->FvMainSegmentSize[1]);
            securityInfo += usprintf("\nFvBaseSegment 2 Address: %08Xh, Size: %Xh", entry->FvMainSegmentBase[2], entry->FvMainSegmentSize[2]);
            securityInfo += usprintf("\nNestedFvBase Address: %08Xh, Size: %Xh", entry->NestedFvBase, entry->NestedFvSize);
            securityInfo += usprintf("\nHash (SHA256): ");
            for (UINT8 j = 0; j < sizeof(entry->Hash); j++) {
                securityInfo += usprintf("%02X", entry->Hash[j]);
            }
            securityInfo += "\n";

            if (entry->FvMainSegmentBase[0] != 0xFFFFFFFF && entry->FvMainSegmentSize[0] != 0 && entry->FvMainSegmentSize[0] != 0xFFFFFFFF) {
                PROTECTED_RANGE range = {};
                range.Offset = entry->FvMainSegmentBase[0];
                range.Size = entry->FvMainSegmentSize[0];
                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                range.Hash = UByteArray((const char*)entry->Hash, sizeof(entry->Hash));
                range.Type = PROTECTED_RANGE_VENDOR_HASH_AMI_V3;
                protectedRanges.push_back(range);
            }

            if (entry->FvMainSegmentBase[1] != 0xFFFFFFFF && entry->FvMainSegmentSize[1] != 0 && entry->FvMainSegmentSize[1] != 0xFFFFFFFF) {
                PROTECTED_RANGE range = {};
                range.Offset = entry->FvMainSegmentBase[1];
                range.Size = entry->FvMainSegmentSize[1];
                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                range.Hash = UByteArray((const char*)entry->Hash, sizeof(entry->Hash));
                range.Type = PROTECTED_RANGE_VENDOR_HASH_AMI_V3;
                protectedRanges.push_back(range);
            }

            if (entry->FvMainSegmentBase[2] != 0xFFFFFFFF && entry->FvMainSegmentSize[2] != 0 && entry->FvMainSegmentSize[2] != 0xFFFFFFFF) {
                PROTECTED_RANGE range = {};
                range.Offset = entry->FvMainSegmentBase[2];
                range.Size = entry->FvMainSegmentSize[2];
                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                range.Hash = UByteArray((const char*)entry->Hash, sizeof(entry->Hash));
                range.Type = PROTECTED_RANGE_VENDOR_HASH_AMI_V3;
                protectedRanges.push_back(range);
            }

            if (entry->NestedFvBase != 0xFFFFFFFF && entry->NestedFvSize != 0 && entry->NestedFvSize != 0xFFFFFFFF) {
                PROTECTED_RANGE range = {};
                range.Offset = entry->NestedFvBase;
                range.Size = entry->NestedFvSize;
                range.AlgorithmId = TCG_HASH_ALGORITHM_ID_SHA256;
                range.Hash = UByteArray((const char*)entry->Hash, sizeof(entry->Hash));
                range.Type = PROTECTED_RANGE_VENDOR_HASH_AMI_V3;
                protectedRanges.push_back(range);
            }

            model->setText(fileIndex, UString("AMI v3 protected ranges hash file"));
        }
        else {
            msg(usprintf("%s: unknown or corrupted AMI protected ranges hash file", __FUNCTION__), fileIndex);
        }
    }

    return U_SUCCESS;
}